

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnCallIndirectExpr(BinaryReaderIR *this,Index sig_index)

{
  Result RVar1;
  Location local_a0;
  Var local_80;
  _Head_base<0UL,_wabt::Expr_*,_false> local_38;
  Expr *local_30;
  
  if ((ulong)sig_index <
      (ulong)((long)(this->module_->func_types).
                    super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->module_->func_types).
                    super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    MakeUnique<wabt::CallIndirectExpr>();
    *(undefined1 *)&local_30[1]._vptr_Expr = 1;
    GetLocation(&local_a0,this);
    Var::Var(&local_80,sig_index,&local_a0);
    Var::operator=((Var *)&local_30[1].super_intrusive_list_base<wabt::Expr>,&local_80);
    Var::~Var(&local_80);
    FuncSignature::operator=
              ((FuncSignature *)&local_30[2].super_intrusive_list_base<wabt::Expr>.prev_,
               &(this->module_->func_types).
                super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
                super__Vector_impl_data._M_start[sig_index]->sig);
    local_38._M_head_impl = local_30;
    local_30 = (Expr *)0x0;
    RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_38);
    if (local_38._M_head_impl != (Expr *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Expr[1])();
    }
    if (local_30 != (Expr *)0x0) {
      (**(code **)(*(long *)local_30 + 8))();
    }
    return (Result)RVar1.enum_;
  }
  __assert_fail("sig_index < module_->func_types.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                ,0x29d,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnCallIndirectExpr(Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnCallIndirectExpr(Index sig_index) {
  assert(sig_index < module_->func_types.size());
  auto expr = MakeUnique<CallIndirectExpr>();
  expr->decl.has_func_type = true;
  expr->decl.type_var = Var(sig_index, GetLocation());
  expr->decl.sig = module_->func_types[sig_index]->sig;
  return AppendExpr(std::move(expr));
}